

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void ** __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::element_at(RepeatedPtrFieldBase *this,int index)

{
  Rep *pRVar1;
  Nonnull<const_char_*> pcVar2;
  
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    if (index == 0) {
      pcVar2 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)index,0,"index == 0");
    }
    if (pcVar2 == (Nonnull<const_char_*>)0x0) {
      return &this->tagged_rep_or_elem_;
    }
    element_at();
  }
  pRVar1 = rep(this);
  return pRVar1->elements + index;
}

Assistant:

void*& element_at(int index) {
    if (using_sso()) {
      ABSL_DCHECK_EQ(index, 0);
      return tagged_rep_or_elem_;
    }
    return rep()->elements[index];
  }